

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFileTests.cc
# Opt level: O3

void avro::codec_traits<unsigned_int>::decode(Decoder *d,uint32_t *v)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> value;
  
  (**(code **)(*(long *)d + 0x68))(d,4);
  *v = uRam0000000000000000;
  operator_delete((void *)0x0,0);
  return;
}

Assistant:

static void decode(Decoder& d, uint32_t& v) {
        std::vector <uint8_t> value;
        d.decodeFixed(sizeof(uint32_t),value);
        memcpy(&v,&(value[0]),sizeof(uint32_t));
    }